

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> __thiscall
slang::ast::CheckerInstanceSymbol::getPortConnections(CheckerInstanceSymbol *this)

{
  long lVar1;
  bool bVar2;
  uint n_;
  _Optional_payload_base<slang::ast::ArgumentDirection> _Var3;
  ASTContext *context_00;
  size_t sVar4;
  group_type *pgVar5;
  value_type *pvVar6;
  raw_key_type *__y;
  __tuple_element_t<0UL,_tuple<const_PropertyExprSyntax_*,_ASTContext>_> *ppPVar7;
  __tuple_element_t<1UL,_tuple<const_PropertyExprSyntax_*,_ASTContext>_> *__src;
  ExpressionSyntax *pEVar8;
  long in_RDI;
  iterator iVar9;
  FormalArgumentSymbol *formal;
  ASTContext context;
  ExpressionSyntax *exprSyntax;
  ActualArg actualArgValue;
  type *argCtx;
  type *expr;
  const_iterator argIt;
  Connection *conn;
  iterator __end2;
  iterator __begin2;
  span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *__range2;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  Type *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  ArgumentDirection in_stack_fffffffffffffdd4;
  span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
  *in_stack_fffffffffffffdd8;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
  *in_stack_fffffffffffffde0;
  equal_to<const_slang::ast::Symbol_*> *in_stack_fffffffffffffde8;
  anon_union_8_2_f12d5f64_for_typeOrLink in_stack_fffffffffffffdf0;
  bitmask<slang::ast::VariableFlags> local_1e2;
  Expression *local_1e0;
  FormalArgumentSymbol *local_1d8;
  bitmask<slang::ast::ASTFlags> local_1d0;
  bitmask<slang::ast::InstanceFlags> local_1c1;
  bitmask<slang::ast::ASTFlags> local_1c0;
  undefined1 local_1b8 [16];
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe58;
  Connection *in_stack_fffffffffffffe60;
  ArgumentDirection in_stack_fffffffffffffe6c;
  Type *in_stack_fffffffffffffe70;
  bitmask<slang::ast::VariableFlags> in_stack_fffffffffffffe7e;
  undefined8 local_178;
  __index_type local_170;
  Symbol *local_150;
  Expression *local_148;
  table_element_pointer local_140;
  SourceLocation local_138;
  Connection *local_130;
  __normal_iterator<slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
  local_128;
  long local_120;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> local_110;
  anon_union_8_2_f12d5f64_for_typeOrLink local_100;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_f8;
  Expression *local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  anon_union_8_2_f12d5f64_for_typeOrLink local_d0;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  local_b0;
  anon_union_8_2_f12d5f64_for_typeOrLink local_98;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_90;
  unkbyte9 Var10;
  anon_union_8_2_f12d5f64_for_typeOrLink aVar11;
  anon_union_8_2_f12d5f64_for_typeOrLink formal_00;
  _Optional_payload_base<slang::ast::ArgumentDirection> propExpr;
  uint local_44;
  pow2_quadratic_prober local_30;
  ASTContext *local_20;
  size_t local_18;
  anon_union_8_2_f12d5f64_for_typeOrLink local_10;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_8;
  
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
    local_120 = in_RDI + 0x58;
    local_128._M_current =
         (Connection *)
         std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::begin
                   ((span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *)
                    in_stack_fffffffffffffdc8);
    local_130 = (Connection *)
                std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::
                end(in_stack_fffffffffffffdd8);
    while (bVar2 = __gnu_cxx::
                   operator==<slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                             ((__normal_iterator<slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                               *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (__normal_iterator<slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffdc8), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_138 = (SourceLocation)
                  __gnu_cxx::
                  __normal_iterator<slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
                  ::operator*(&local_128);
      Connection::getOutputInitialExpr(in_stack_fffffffffffffe60);
      lVar1 = *(long *)(*(long *)(in_RDI + 0x50) + 0x88);
      _Var3 = (_Optional_payload_base<slang::ast::ArgumentDirection>)(lVar1 + 0x18);
      local_150 = *(Symbol **)((long)local_138 + 8);
      local_100.typeSyntax = (DataTypeSyntax *)&local_150;
      local_f8 = _Var3;
      local_d0.typeSyntax = local_100.typeSyntax;
      local_c8 = _Var3;
      local_98.typeSyntax = local_100.typeSyntax;
      local_90 = _Var3;
      aVar11.typeSyntax = local_100.typeSyntax;
      propExpr = _Var3;
      context_00 = (ASTContext *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                   ::hash_for<slang::ast::Symbol_const*>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (Symbol **)in_stack_fffffffffffffdc8);
      formal_00 = aVar11;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                                (size_t)in_stack_fffffffffffffdc8);
      local_20 = context_00;
      local_10 = aVar11;
      local_8 = _Var3;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        sVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        pgVar5 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                           *)0x8e37d5);
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffdd8,
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        if (local_44 != 0) {
          pvVar6 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                               *)0x8e3820);
          do {
            n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffffde8 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                         *)0x8e3870);
            in_stack_fffffffffffffdf0 = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                  ::
                  key_from<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                            ((pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                              *)0x8e389d);
            bVar2 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                              (in_stack_fffffffffffffde8,
                               (Symbol **)in_stack_fffffffffffffdf0.typeSyntax,__y);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
              ::table_locator(&local_b0,pgVar5 + sVar4,n_,pvVar6 + sVar4 * 0xf + (ulong)n_);
              goto LAB_008e3991;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                           (size_t)in_stack_fffffffffffffdc8);
        if (bVar2) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
          ::table_locator(&local_b0);
          goto LAB_008e3991;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,*(size_t *)(lVar1 + 0x20));
      } while (bVar2);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
      ::table_locator(&local_b0);
LAB_008e3991:
      iVar9 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
              ::make_iterator((locator *)0x8e399e);
      local_e0.pc_ = iVar9.pc_;
      local_e0.p_ = iVar9.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      Var10 = iVar9._7_9_;
      local_f0 = (Expression *)local_c0.pc_;
      local_e8 = local_c0.p_;
      local_148 = (Expression *)local_c0.pc_;
      local_140 = local_c0.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      ppPVar7 = std::get<0ul,slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>
                          ((tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            *)0x8e3a4b);
      __src = std::get<1ul,slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>
                        ((tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *
                         )0x8e3a60);
      if (*ppPVar7 != (__tuple_element_t<0UL,_tuple<const_PropertyExprSyntax_*,_ASTContext>_>)0x0) {
        if ((*(Symbol **)((long)local_138 + 8))->kind == AssertionPort) {
          std::
          variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
          ::variant((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     *)0x8e3a99);
          in_stack_fffffffffffffde0 =
               (span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *)
               *ppPVar7;
          Symbol::as<slang::ast::AssertionPortSymbol>((Symbol *)0x8e3aba);
          bVar2 = AssertionInstanceExpression::checkAssertionArg
                            ((PropertyExprSyntax *)propExpr,
                             (AssertionPortSymbol *)formal_00.typeSyntax,context_00,
                             (ActualArg *)((unkuint9)Var10 >> 8),SUB91(Var10,0));
          if (bVar2) {
            (((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               *)((long)local_138 + 0x10))->
            super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            ).
            super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            .
            super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
            ._M_u = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     )local_178;
            *(__index_type *)((long)local_138 + 0x18) = local_170;
          }
        }
        else {
          pEVar8 = ASTContext::requireSimpleExpr
                             ((ASTContext *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (PropertyExprSyntax *)in_stack_fffffffffffffdc8);
          if (pEVar8 != (ExpressionSyntax *)0x0) {
            memcpy(local_1b8,__src,0x38);
            if ((*(byte *)(*(long *)(in_RDI + 0x50) + 0x94) & 1) == 0) {
              bitmask<slang::ast::ASTFlags>::bitmask(&local_1c0,NonProcedural);
              bitmask<slang::ast::ASTFlags>::operator|=
                        ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe58,&local_1c0);
            }
            in_stack_fffffffffffffdd8 =
                 (span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> *)
                 (*(long *)(in_RDI + 0x50) + 0x95);
            bitmask<slang::ast::InstanceFlags>::bitmask(&local_1c1,FromBind);
            bVar2 = bitmask<slang::ast::InstanceFlags>::has
                              ((bitmask<slang::ast::InstanceFlags> *)
                               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                               (bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffdc8);
            if (bVar2) {
              bitmask<slang::ast::ASTFlags>::bitmask(&local_1d0,BindInstantiation);
              bitmask<slang::ast::ASTFlags>::operator|=
                        ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe58,&local_1d0);
            }
            local_1d8 = Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0x8e3bf6);
            in_stack_fffffffffffffdc8 = ValueSymbol::getType((ValueSymbol *)0x8e3c05);
            in_stack_fffffffffffffdd4 = local_1d8->direction;
            memset(&local_1e2,0,2);
            bitmask<slang::ast::VariableFlags>::bitmask(&local_1e2);
            local_1e0 = Expression::bindArgument
                                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                   in_stack_fffffffffffffe7e,
                                   (ExpressionSyntax *)in_stack_fffffffffffffe60,
                                   (ASTContext *)in_stack_fffffffffffffe58.m_bits);
            std::
            variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
            ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                         *)in_stack_fffffffffffffdf0.typeSyntax,
                        (Expression **)in_stack_fffffffffffffde8);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<slang::ast::CheckerInstanceSymbol::Connection_*,_std::span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>_>
      ::operator++(&local_128);
    }
    std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::
    span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  else {
    std::span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>::
    span<slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  return local_110;
}

Assistant:

std::span<const CheckerInstanceSymbol::Connection> CheckerInstanceSymbol::getPortConnections()
    const {
    if (connectionsResolved)
        return connections;

    connectionsResolved = true;

    // We prepopulated some of the connection members but still need
    // to resolve the actual argument value and save it.
    for (auto& conn : connections) {
        conn.getOutputInitialExpr();

        auto argIt = body.assertionDetails.argumentMap.find(&conn.formal);
        SLANG_ASSERT(argIt != body.assertionDetails.argumentMap.end());

        auto& [expr, argCtx] = argIt->second;
        if (!expr)
            continue;

        if (conn.formal.kind == SymbolKind::AssertionPort) {
            AssertionInstanceExpression::ActualArg actualArgValue;
            if (AssertionInstanceExpression::checkAssertionArg(
                    *expr, conn.formal.as<AssertionPortSymbol>(), argCtx, actualArgValue,
                    /* isRecursiveProp */ false)) {
                conn.actual = actualArgValue;
            }
        }
        else if (auto exprSyntax = argCtx.requireSimpleExpr(*expr)) {
            ASTContext context = argCtx;
            if (!body.isProcedural)
                context.flags |= ASTFlags::NonProcedural;

            if (body.flags.has(InstanceFlags::FromBind))
                context.flags |= ASTFlags::BindInstantiation;

            auto& formal = conn.formal.as<FormalArgumentSymbol>();
            conn.actual = &Expression::bindArgument(formal.getType(), formal.direction, {},
                                                    *exprSyntax, context);
        }
    }

    return connections;
}